

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall
Assimp::ASE::Parser::ParseLV4MeshBonesVertices(Parser *this,uint iNumVertices,Mesh *mesh)

{
  vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *this_00;
  byte bVar1;
  Assimp AVar2;
  iterator __position;
  byte *pbVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  uint uVar8;
  Assimp *this_01;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  pair<int,_float> pairOut;
  ai_real afVert [3];
  pair<int,_float> local_50;
  ulong local_48;
  ai_real aaStack_3c [3];
  
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
            (&mesh->mBoneVertices,(ulong)iNumVertices);
  local_48 = 0;
LAB_00414e4b:
  do {
    pcVar6 = this->filePtr;
    if (*pcVar6 == '*') {
      this->filePtr = pcVar6 + 1;
      iVar4 = strncmp("MESH_BONE_VERTEX",pcVar6 + 1,0x10);
      if (iVar4 == 0) {
        bVar1 = pcVar6[0x11];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar5 = pcVar6 + 0x12;
          if (bVar1 == 0) {
            pcVar5 = pcVar6 + 0x11;
          }
          this->filePtr = pcVar5;
          cVar7 = pcVar6[0x12 - (ulong)(bVar1 == 0)];
          uVar9 = 0;
          if (0xf5 < (byte)(cVar7 - 0x3aU)) {
            uVar9 = 0;
            do {
              uVar9 = (uint)(byte)(cVar7 - 0x30) + uVar9 * 10;
              cVar7 = pcVar5[1];
              pcVar5 = pcVar5 + 1;
            } while (0xf5 < (byte)(cVar7 - 0x3aU));
          }
          this->filePtr = pcVar5;
          uVar10 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
          if (uVar10 < uVar9 || uVar10 - uVar9 == 0) {
            uVar9 = (int)uVar10 - 1;
            LogWarning(this,
                       "Bone vertex index is out of bounds. Using the largest valid bone vertex index instead"
                      );
          }
          lVar11 = 0;
          do {
            ParseLV4MeshFloat(this,(ai_real *)((long)aaStack_3c + lVar11));
            lVar11 = lVar11 + 4;
          } while (lVar11 != 0xc);
          local_50.first = 0;
          local_50.second = 0.0;
          while( true ) {
            for (this_01 = (Assimp *)this->filePtr;
                (*this_01 == (Assimp)0x20 || (*this_01 == (Assimp)0x9)); this_01 = this_01 + 1) {
            }
            this->filePtr = (char *)this_01;
            AVar2 = *this_01;
            if (((byte)AVar2 < 0xe) && ((0x3401U >> ((byte)AVar2 & 0x1f) & 1) != 0)) break;
            iVar4 = 0;
            if (0xf5 < (byte)((char)AVar2 - 0x3aU)) {
              iVar4 = 0;
              do {
                iVar4 = (uint)(byte)((char)AVar2 - 0x30) + iVar4 * 10;
                AVar2 = this_01[1];
                this_01 = this_01 + 1;
              } while (0xf5 < (byte)((char)AVar2 - 0x3aU));
            }
            this->filePtr = (char *)this_01;
            local_50.first = iVar4;
            for (; (*this_01 == (Assimp)0x20 || (*this_01 == (Assimp)0x9)); this_01 = this_01 + 1) {
            }
            this->filePtr = (char *)this_01;
            if (((byte)*this_01 < 0xe) && ((0x3401U >> ((byte)*this_01 & 0x1f) & 1) != 0)) break;
            pcVar6 = fast_atoreal_move<float>
                               (this_01,(char *)&local_50.second,(float *)0x1,SUB41(iVar4,0));
            this->filePtr = pcVar6;
            if (local_50.first != -1) {
              this_00 = (vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
                        ((mesh->mBoneVertices).
                         super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar9);
              __position._M_current = *(pair<int,_float> **)(this_00 + 8);
              if (__position._M_current == *(pair<int,_float> **)(this_00 + 0x10)) {
                std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
                _M_realloc_insert<std::pair<int,float>const&>(this_00,__position,&local_50);
              }
              else {
                *__position._M_current = local_50;
                *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
              }
            }
          }
          goto LAB_00414e4b;
        }
      }
    }
    pbVar3 = (byte *)this->filePtr;
    bVar1 = *pbVar3;
    uVar9 = (uint)bVar1;
    if (bVar1 == 0x7b) {
      local_48 = (ulong)((int)local_48 + 1);
    }
    else if (bVar1 == 0x7d) {
      uVar8 = (int)local_48 - 1;
      local_48 = (ulong)uVar8;
      if (uVar8 == 0) {
        this->filePtr = (char *)(pbVar3 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar9 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *MESH_BONE_VERTEX chunk (Level 4)");
    }
    if (((uVar9 < 0xe) && ((0x3401U >> (uVar9 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar3 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBonesVertices(unsigned int iNumVertices,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBoneVertices.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone vertex
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX" ,16))
            {
                // read the vertex index
                unsigned int iIndex = strtoul10(filePtr,&filePtr);
                if (iIndex >= mesh.mPositions.size())
                {
                    iIndex = (unsigned int)mesh.mPositions.size()-1;
                    LogWarning("Bone vertex index is out of bounds. Using the largest valid "
                        "bone vertex index instead");
                }

                // --- ignored
                ai_real afVert[3];
                ParseLV4MeshFloatTriple(afVert);

                std::pair<int,float> pairOut;
                while (true)
                {
                    // first parse the bone index ...
                    if (!SkipSpaces(&filePtr))break;
                    pairOut.first = strtoul10(filePtr,&filePtr);

                    // then parse the vertex weight
                    if (!SkipSpaces(&filePtr))break;
                    filePtr = fast_atoreal_move<float>(filePtr,pairOut.second);

                    // -1 marks unused entries
                    if (-1 != pairOut.first)
                    {
                        mesh.mBoneVertices[iIndex].mBoneWeights.push_back(pairOut);
                    }
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("4","*MESH_BONE_VERTEX");
    }
    return;
}